

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_file_reader_teardown_close(mpack_reader_t *reader)

{
  int iVar1;
  
  if ((FILE *)reader->context != (FILE *)0x0) {
    iVar1 = fclose((FILE *)reader->context);
    if ((iVar1 != 0) && (reader->error == mpack_ok)) {
      reader->error = mpack_error_io;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_io);
      }
    }
  }
  free(reader->buffer);
  reader->context = (void *)0x0;
  reader->fill = (mpack_reader_fill_t)0x0;
  reader->teardown = (mpack_reader_teardown_t)0x0;
  reader->skip = (mpack_reader_skip_t)0x0;
  reader->buffer = (char *)0x0;
  reader->size = 0;
  return;
}

Assistant:

static void mpack_file_reader_teardown_close(mpack_reader_t* reader) {
    FILE* file = (FILE*)reader->context;

    if (file) {
        int ret = fclose(file);
        if (ret != 0)
            mpack_reader_flag_error(reader, mpack_error_io);
    }

    mpack_file_reader_teardown(reader);
}